

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *palVar18;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  int16_t iVar25;
  char *__format;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int32_t t;
  long lVar34;
  ushort uVar35;
  undefined4 uVar36;
  ulong uVar38;
  ushort uVar45;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar39 [16];
  undefined4 uVar37;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ushort uVar44;
  ushort uVar46;
  ushort uVar50;
  undefined1 auVar42 [16];
  __m128i alVar43;
  short sVar51;
  short sVar55;
  ulong uVar52;
  short sVar56;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  undefined1 auVar57 [16];
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar87;
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffe58;
  __m128i *local_198;
  short local_e8;
  short sStack_e6;
  short local_d8;
  short sStack_d6;
  ushort local_98;
  ushort uStack_96;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  __m128i_16_t e;
  __m128i_16_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "open";
        }
        else {
          if (-1 < gap) {
            uVar22 = uVar3 - 1;
            uVar19 = (ulong)uVar3 + 7 >> 3;
            uVar38 = (ulong)uVar22 % uVar19;
            uVar27 = -open;
            uVar28 = ppVar5->min;
            iVar16 = -uVar28;
            if (uVar28 != uVar27 && SBORROW4(uVar28,uVar27) == (int)(uVar28 + open) < 0) {
              iVar16 = open;
            }
            iVar32 = ppVar5->max;
            ppVar17 = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x8220802;
              local_198 = parasail_memalign___m128i(0x10,uVar19);
              palVar18 = parasail_memalign___m128i(0x10,uVar19);
              ptr = parasail_memalign___m128i(0x10,uVar19);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0) &&
                  (palVar18 != (__m128i *)0x0 && local_198 != (__m128i *)0x0)) {
                iVar13 = s2Len + -1;
                uVar21 = 7 - (int)(uVar22 / uVar19);
                auVar39 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar36 = auVar39._0_4_;
                auVar39 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar37 = auVar39._0_4_;
                uVar14 = iVar16 - 0x7fff;
                auVar39 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0);
                local_d8 = auVar39._0_2_;
                sStack_d6 = auVar39._2_2_;
                auVar40 = ZEXT416(CONCAT22((short)(uVar28 >> 0x10),0x7ffe - (short)iVar32));
                auVar40 = pshuflw(auVar40,auVar40,0);
                auVar41 = pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
                local_e8 = auVar41._0_2_;
                sStack_e6 = auVar41._2_2_;
                lVar34 = (long)(int)uVar27;
                for (uVar26 = 0; uVar26 != uVar19; uVar26 = uVar26 + 1) {
                  lVar30 = lVar34;
                  for (lVar31 = 0; lVar31 != 8; lVar31 = lVar31 + 1) {
                    lVar23 = lVar30;
                    if (s1_beg != 0) {
                      lVar23 = 0;
                    }
                    lVar33 = -0x8000;
                    if (-0x8000 < lVar23) {
                      lVar33 = lVar23;
                    }
                    lVar23 = lVar23 - (ulong)(uint)open;
                    if (lVar23 < -0x7fff) {
                      lVar23 = -0x8000;
                    }
                    *(short *)((long)&h + lVar31 * 2) = (short)lVar33;
                    *(short *)((long)&e + lVar31 * 2) = (short)lVar23;
                    lVar30 = lVar30 - uVar19 * (uint)gap;
                  }
                  local_198[uVar26][0] = h.m[0];
                  local_198[uVar26][1] = h.m[1];
                  ptr[uVar26][0] = e.m[0];
                  ptr[uVar26][1] = e.m[1];
                  lVar34 = lVar34 - (ulong)(uint)gap;
                }
                *ptr_00 = 0;
                uVar29 = (ulong)(uint)gap;
                uVar28 = uVar27;
                for (uVar26 = 1; s2Len + 1 != uVar26; uVar26 = uVar26 + 1) {
                  iVar25 = -0x8000;
                  if (-0x8000 < (int)uVar28) {
                    iVar25 = (int16_t)uVar28;
                  }
                  if (s2_beg != 0) {
                    iVar25 = 0;
                  }
                  ptr_00[uVar26] = iVar25;
                  uVar28 = uVar28 - gap;
                }
                uVar28 = (uint)uVar19;
                uVar26 = 0;
                local_98 = auVar40._0_2_;
                uStack_96 = auVar40._2_2_;
                auVar41._4_2_ = local_d8;
                auVar41._0_4_ = auVar39._0_4_;
                auVar41._6_2_ = sStack_d6;
                auVar41._8_2_ = local_d8;
                auVar41._10_2_ = sStack_d6;
                auVar41._12_2_ = local_d8;
                auVar41._14_2_ = sStack_d6;
                auVar40 = auVar41;
                iVar16 = iVar13;
                uVar71 = local_98;
                uVar72 = uStack_96;
                uVar73 = local_98;
                uVar74 = uStack_96;
                uVar75 = local_98;
                uVar76 = uStack_96;
                uVar77 = local_98;
                uVar78 = uStack_96;
                do {
                  ptr_01 = palVar18;
                  if (uVar26 == (uint)s2Len) {
                    if (s2_end != 0) {
                      iVar32 = 0;
                      while( true ) {
                        uVar19 = auVar41._0_8_;
                        lVar34 = auVar41._8_8_;
                        if ((int)uVar21 <= iVar32) break;
                        auVar41._0_8_ = uVar19 << 0x10;
                        auVar41._8_8_ = lVar34 << 0x10 | uVar19 >> 0x30;
                        iVar32 = iVar32 + 1;
                      }
                      uVar14 = (uint)auVar41._14_2_;
                    }
                    uVar35 = (ushort)uVar14;
                    uVar27 = uVar22;
                    if (s1_end != 0) {
                      uVar19 = 0;
                      while( true ) {
                        uVar35 = (ushort)uVar14;
                        if ((uVar28 & 0xfffffff) << 3 == (uint)uVar19) break;
                        uVar15 = ((uint)uVar19 & 7) * uVar28 + ((uint)(uVar19 >> 3) & 0x1fffffff);
                        if ((int)uVar15 < (int)uVar3) {
                          uVar44 = *(ushort *)((long)*local_198 + uVar19 * 2);
                          if ((short)uVar35 < (short)uVar44) {
                            uVar14 = (uint)uVar44;
                            iVar16 = iVar13;
                            uVar27 = uVar15;
                          }
                          else {
                            if ((int)uVar27 <= (int)uVar15) {
                              uVar15 = uVar27;
                            }
                            if (iVar16 != iVar13) {
                              uVar15 = uVar27;
                            }
                            if (uVar44 == uVar35) {
                              uVar27 = uVar15;
                            }
                          }
                        }
                        uVar19 = uVar19 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar43 = local_198[uVar38];
                      iVar16 = 0;
                      while( true ) {
                        uVar38 = alVar43[0];
                        lVar34 = alVar43[1];
                        if ((int)uVar21 <= iVar16) break;
                        alVar43[0] = uVar38 << 0x10;
                        alVar43[1] = lVar34 << 0x10 | uVar38 >> 0x30;
                        iVar16 = iVar16 + 1;
                      }
                      uVar35 = alVar43[1]._6_2_;
                      iVar16 = iVar13;
                      uVar27 = uVar22;
                    }
                    auVar39._0_2_ = -(ushort)((short)uVar71 < local_d8);
                    auVar39._2_2_ = -(ushort)((short)uVar72 < sStack_d6);
                    auVar39._4_2_ = -(ushort)((short)uVar73 < local_d8);
                    auVar39._6_2_ = -(ushort)((short)uVar74 < sStack_d6);
                    auVar39._8_2_ = -(ushort)((short)uVar75 < local_d8);
                    auVar39._10_2_ = -(ushort)((short)uVar76 < sStack_d6);
                    auVar39._12_2_ = -(ushort)((short)uVar77 < local_d8);
                    auVar39._14_2_ = -(ushort)((short)uVar78 < sStack_d6);
                    auVar57._0_2_ = -(ushort)((short)local_98 < auVar40._0_2_);
                    auVar57._2_2_ = -(ushort)((short)uStack_96 < auVar40._2_2_);
                    auVar57._4_2_ = -(ushort)((short)local_98 < auVar40._4_2_);
                    auVar57._6_2_ = -(ushort)((short)uStack_96 < auVar40._6_2_);
                    auVar57._8_2_ = -(ushort)((short)local_98 < auVar40._8_2_);
                    auVar57._10_2_ = -(ushort)((short)uStack_96 < auVar40._10_2_);
                    auVar57._12_2_ = -(ushort)((short)local_98 < auVar40._12_2_);
                    auVar57._14_2_ = -(ushort)((short)uStack_96 < auVar40._14_2_);
                    auVar57 = auVar57 | auVar39;
                    if ((((((((((((((((auVar57 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar57 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar57 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar57 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar57 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar57 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar57 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar57 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar57 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar57 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar57 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar57 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar57 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar57[0xf] < '\0') {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      uVar35 = 0;
                      iVar16 = 0;
                      uVar27 = 0;
                    }
                    ppVar17->score = (int)(short)uVar35;
                    ppVar17->end_query = uVar27;
                    ppVar17->end_ref = iVar16;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_01);
                    parasail_free(local_198);
                    return ppVar17;
                  }
                  uVar24 = local_198[uVar28 - 1][0];
                  iVar32 = ppVar5->mapper[(byte)s2[uVar26]];
                  auVar80._8_8_ = local_198[uVar28 - 1][1] << 0x10 | uVar24 >> 0x30;
                  auVar80._0_8_ = uVar24 << 0x10 | (ulong)(ushort)ptr_00[uVar26];
                  lVar34 = 0;
                  auVar53._4_2_ = local_d8;
                  auVar53._0_4_ = auVar39._0_4_;
                  auVar53._6_2_ = sStack_d6;
                  auVar53._8_2_ = local_d8;
                  auVar53._10_2_ = sStack_d6;
                  auVar53._12_2_ = local_d8;
                  auVar53._14_2_ = sStack_d6;
                  for (uVar24 = 0; t = (int32_t)uVar26, uVar19 != uVar24; uVar24 = uVar24 + 1) {
                    auVar79 = paddsw(auVar80,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar34 + (long)(int)(iVar32 * uVar28) * 0x10));
                    pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar34);
                    sVar81 = *(short *)*pauVar2;
                    sVar82 = *(short *)(*pauVar2 + 2);
                    sVar83 = *(short *)(*pauVar2 + 4);
                    sVar84 = *(short *)(*pauVar2 + 6);
                    sVar85 = *(short *)(*pauVar2 + 8);
                    sVar86 = *(short *)(*pauVar2 + 10);
                    sVar87 = *(short *)(*pauVar2 + 0xc);
                    sVar6 = *(short *)(*pauVar2 + 0xe);
                    auVar80 = *pauVar2;
                    sVar55 = auVar53._0_2_;
                    uVar35 = (ushort)(sVar81 < sVar55) * sVar55 |
                             (ushort)(sVar81 >= sVar55) * sVar81;
                    sVar60 = auVar53._2_2_;
                    uVar44 = (ushort)(sVar82 < sVar60) * sVar60 |
                             (ushort)(sVar82 >= sVar60) * sVar82;
                    sVar62 = auVar53._4_2_;
                    uVar45 = (ushort)(sVar83 < sVar62) * sVar62 |
                             (ushort)(sVar83 >= sVar62) * sVar83;
                    sVar64 = auVar53._6_2_;
                    uVar46 = (ushort)(sVar84 < sVar64) * sVar64 |
                             (ushort)(sVar84 >= sVar64) * sVar84;
                    sVar66 = auVar53._8_2_;
                    uVar47 = (ushort)(sVar85 < sVar66) * sVar66 |
                             (ushort)(sVar85 >= sVar66) * sVar85;
                    sVar68 = auVar53._10_2_;
                    uVar48 = (ushort)(sVar86 < sVar68) * sVar68 |
                             (ushort)(sVar86 >= sVar68) * sVar86;
                    sVar70 = auVar53._12_2_;
                    uVar49 = (ushort)(sVar87 < sVar70) * sVar70 |
                             (ushort)(sVar87 >= sVar70) * sVar87;
                    sVar51 = auVar53._14_2_;
                    uVar50 = (ushort)(sVar6 < sVar51) * sVar51 | (ushort)(sVar6 >= sVar51) * sVar6;
                    sVar56 = auVar79._0_2_;
                    uVar35 = (ushort)((short)uVar35 < sVar56) * sVar56 |
                             ((short)uVar35 >= sVar56) * uVar35;
                    sVar56 = auVar79._2_2_;
                    uVar44 = (ushort)((short)uVar44 < sVar56) * sVar56 |
                             ((short)uVar44 >= sVar56) * uVar44;
                    sVar56 = auVar79._4_2_;
                    uVar45 = (ushort)((short)uVar45 < sVar56) * sVar56 |
                             ((short)uVar45 >= sVar56) * uVar45;
                    sVar56 = auVar79._6_2_;
                    uVar46 = (ushort)((short)uVar46 < sVar56) * sVar56 |
                             ((short)uVar46 >= sVar56) * uVar46;
                    sVar56 = auVar79._8_2_;
                    uVar47 = (ushort)((short)uVar47 < sVar56) * sVar56 |
                             ((short)uVar47 >= sVar56) * uVar47;
                    sVar56 = auVar79._10_2_;
                    uVar48 = (ushort)((short)uVar48 < sVar56) * sVar56 |
                             ((short)uVar48 >= sVar56) * uVar48;
                    sVar56 = auVar79._12_2_;
                    uVar49 = (ushort)((short)uVar49 < sVar56) * sVar56 |
                             ((short)uVar49 >= sVar56) * uVar49;
                    sVar56 = auVar79._14_2_;
                    uVar50 = (ushort)((short)uVar50 < sVar56) * sVar56 |
                             ((short)uVar50 >= sVar56) * uVar50;
                    puVar1 = (ushort *)((long)*ptr_01 + lVar34);
                    *puVar1 = uVar35;
                    puVar1[1] = uVar44;
                    puVar1[2] = uVar45;
                    puVar1[3] = uVar46;
                    puVar1[4] = uVar47;
                    puVar1[5] = uVar48;
                    puVar1[6] = uVar49;
                    puVar1[7] = uVar50;
                    sVar56 = auVar40._0_2_;
                    sVar58 = auVar40._2_2_;
                    sVar59 = auVar40._4_2_;
                    sVar61 = auVar40._6_2_;
                    sVar63 = auVar40._8_2_;
                    sVar65 = auVar40._10_2_;
                    sVar67 = auVar40._12_2_;
                    sVar69 = auVar40._14_2_;
                    uVar71 = (ushort)(sVar81 < (short)uVar71) * sVar81 |
                             (sVar81 >= (short)uVar71) * uVar71;
                    uVar72 = (ushort)(sVar82 < (short)uVar72) * sVar82 |
                             (sVar82 >= (short)uVar72) * uVar72;
                    uVar73 = (ushort)(sVar83 < (short)uVar73) * sVar83 |
                             (sVar83 >= (short)uVar73) * uVar73;
                    uVar74 = (ushort)(sVar84 < (short)uVar74) * sVar84 |
                             (sVar84 >= (short)uVar74) * uVar74;
                    uVar75 = (ushort)(sVar85 < (short)uVar75) * sVar85 |
                             (sVar85 >= (short)uVar75) * uVar75;
                    uVar76 = (ushort)(sVar86 < (short)uVar76) * sVar86 |
                             (sVar86 >= (short)uVar76) * uVar76;
                    uVar77 = (ushort)(sVar87 < (short)uVar77) * sVar87 |
                             (sVar87 >= (short)uVar77) * uVar77;
                    uVar78 = (ushort)(sVar6 < (short)uVar78) * sVar6 |
                             (sVar6 >= (short)uVar78) * uVar78;
                    uVar71 = (ushort)(sVar55 < (short)uVar71) * sVar55 |
                             (sVar55 >= (short)uVar71) * uVar71;
                    uVar72 = (ushort)(sVar60 < (short)uVar72) * sVar60 |
                             (sVar60 >= (short)uVar72) * uVar72;
                    uVar73 = (ushort)(sVar62 < (short)uVar73) * sVar62 |
                             (sVar62 >= (short)uVar73) * uVar73;
                    uVar74 = (ushort)(sVar64 < (short)uVar74) * sVar64 |
                             (sVar64 >= (short)uVar74) * uVar74;
                    uVar75 = (ushort)(sVar66 < (short)uVar75) * sVar66 |
                             (sVar66 >= (short)uVar75) * uVar75;
                    uVar76 = (ushort)(sVar68 < (short)uVar76) * sVar68 |
                             (sVar68 >= (short)uVar76) * uVar76;
                    uVar77 = (ushort)(sVar70 < (short)uVar77) * sVar70 |
                             (sVar70 >= (short)uVar77) * uVar77;
                    uVar78 = (ushort)(sVar51 < (short)uVar78) * sVar51 |
                             (sVar51 >= (short)uVar78) * uVar78;
                    uVar71 = ((short)uVar35 < (short)uVar71) * uVar35 |
                             ((short)uVar35 >= (short)uVar71) * uVar71;
                    uVar72 = ((short)uVar44 < (short)uVar72) * uVar44 |
                             ((short)uVar44 >= (short)uVar72) * uVar72;
                    uVar73 = ((short)uVar45 < (short)uVar73) * uVar45 |
                             ((short)uVar45 >= (short)uVar73) * uVar73;
                    uVar74 = ((short)uVar46 < (short)uVar74) * uVar46 |
                             ((short)uVar46 >= (short)uVar74) * uVar74;
                    uVar75 = ((short)uVar47 < (short)uVar75) * uVar47 |
                             ((short)uVar47 >= (short)uVar75) * uVar75;
                    uVar76 = ((short)uVar48 < (short)uVar76) * uVar48 |
                             ((short)uVar48 >= (short)uVar76) * uVar76;
                    uVar77 = ((short)uVar49 < (short)uVar77) * uVar49 |
                             ((short)uVar49 >= (short)uVar77) * uVar77;
                    uVar78 = ((short)uVar50 < (short)uVar78) * uVar50 |
                             ((short)uVar50 >= (short)uVar78) * uVar78;
                    vH[0] = uVar24 & 0xffffffff;
                    vH[1] = uVar19;
                    arr_store_si128(((ppVar17->field_4).rowcols)->score_row,vH,t,s2Len,
                                    (int32_t)uVar29,in_stack_fffffffffffffe58);
                    auVar40._2_2_ =
                         (sVar58 < (short)uVar44) * uVar44 |
                         (ushort)(sVar58 >= (short)uVar44) * sVar58;
                    auVar40._0_2_ =
                         (sVar56 < (short)uVar35) * uVar35 |
                         (ushort)(sVar56 >= (short)uVar35) * sVar56;
                    auVar40._4_2_ =
                         (sVar59 < (short)uVar45) * uVar45 |
                         (ushort)(sVar59 >= (short)uVar45) * sVar59;
                    auVar40._6_2_ =
                         (sVar61 < (short)uVar46) * uVar46 |
                         (ushort)(sVar61 >= (short)uVar46) * sVar61;
                    auVar40._8_2_ =
                         (sVar63 < (short)uVar47) * uVar47 |
                         (ushort)(sVar63 >= (short)uVar47) * sVar63;
                    auVar40._10_2_ =
                         (sVar65 < (short)uVar48) * uVar48 |
                         (ushort)(sVar65 >= (short)uVar48) * sVar65;
                    auVar40._12_2_ =
                         (sVar67 < (short)uVar49) * uVar49 |
                         (ushort)(sVar67 >= (short)uVar49) * sVar67;
                    auVar40._14_2_ =
                         (sVar69 < (short)uVar50) * uVar50 |
                         (ushort)(sVar69 >= (short)uVar50) * sVar69;
                    auVar79._2_2_ = uVar44;
                    auVar79._0_2_ = uVar35;
                    auVar79._4_2_ = uVar45;
                    auVar79._6_2_ = uVar46;
                    auVar79._8_2_ = uVar47;
                    auVar79._10_2_ = uVar48;
                    auVar79._12_2_ = uVar49;
                    auVar79._14_2_ = uVar50;
                    auVar11._4_4_ = uVar36;
                    auVar11._0_4_ = uVar36;
                    auVar11._8_4_ = uVar36;
                    auVar11._12_4_ = uVar36;
                    auVar79 = psubsw(auVar79,auVar11);
                    auVar9._4_4_ = uVar37;
                    auVar9._0_4_ = uVar37;
                    auVar9._8_4_ = uVar37;
                    auVar9._12_4_ = uVar37;
                    auVar80 = psubsw(auVar80,auVar9);
                    sVar55 = auVar79._0_2_;
                    sVar51 = auVar80._0_2_;
                    sVar56 = auVar79._2_2_;
                    sVar81 = auVar80._2_2_;
                    sVar60 = auVar79._4_2_;
                    sVar82 = auVar80._4_2_;
                    sVar62 = auVar79._6_2_;
                    sVar83 = auVar80._6_2_;
                    sVar64 = auVar79._8_2_;
                    sVar84 = auVar80._8_2_;
                    sVar66 = auVar79._10_2_;
                    sVar85 = auVar80._10_2_;
                    sVar68 = auVar79._12_2_;
                    sVar86 = auVar80._12_2_;
                    sVar87 = auVar80._14_2_;
                    sVar70 = auVar79._14_2_;
                    puVar1 = (ushort *)((long)*ptr + lVar34);
                    *puVar1 = (ushort)(sVar51 < sVar55) * sVar55 |
                              (ushort)(sVar51 >= sVar55) * sVar51;
                    puVar1[1] = (ushort)(sVar81 < sVar56) * sVar56 |
                                (ushort)(sVar81 >= sVar56) * sVar81;
                    puVar1[2] = (ushort)(sVar82 < sVar60) * sVar60 |
                                (ushort)(sVar82 >= sVar60) * sVar82;
                    puVar1[3] = (ushort)(sVar83 < sVar62) * sVar62 |
                                (ushort)(sVar83 >= sVar62) * sVar83;
                    puVar1[4] = (ushort)(sVar84 < sVar64) * sVar64 |
                                (ushort)(sVar84 >= sVar64) * sVar84;
                    puVar1[5] = (ushort)(sVar85 < sVar66) * sVar66 |
                                (ushort)(sVar85 >= sVar66) * sVar85;
                    puVar1[6] = (ushort)(sVar86 < sVar68) * sVar68 |
                                (ushort)(sVar86 >= sVar68) * sVar86;
                    puVar1[7] = (ushort)(sVar87 < sVar70) * sVar70 |
                                (ushort)(sVar87 >= sVar70) * sVar87;
                    auVar80 = psubsw(auVar53,auVar9);
                    sVar51 = auVar80._0_2_;
                    auVar53._0_2_ =
                         (ushort)(sVar51 < sVar55) * sVar55 | (ushort)(sVar51 >= sVar55) * sVar51;
                    sVar55 = auVar80._2_2_;
                    auVar53._2_2_ =
                         (ushort)(sVar55 < sVar56) * sVar56 | (ushort)(sVar55 >= sVar56) * sVar55;
                    sVar55 = auVar80._4_2_;
                    auVar53._4_2_ =
                         (ushort)(sVar55 < sVar60) * sVar60 | (ushort)(sVar55 >= sVar60) * sVar55;
                    sVar55 = auVar80._6_2_;
                    auVar53._6_2_ =
                         (ushort)(sVar55 < sVar62) * sVar62 | (ushort)(sVar55 >= sVar62) * sVar55;
                    sVar55 = auVar80._8_2_;
                    auVar53._8_2_ =
                         (ushort)(sVar55 < sVar64) * sVar64 | (ushort)(sVar55 >= sVar64) * sVar55;
                    sVar55 = auVar80._10_2_;
                    auVar53._10_2_ =
                         (ushort)(sVar55 < sVar66) * sVar66 | (ushort)(sVar55 >= sVar66) * sVar55;
                    sVar55 = auVar80._12_2_;
                    sVar56 = auVar80._14_2_;
                    auVar53._12_2_ =
                         (ushort)(sVar55 < sVar68) * sVar68 | (ushort)(sVar55 >= sVar68) * sVar55;
                    auVar53._14_2_ =
                         (ushort)(sVar56 < sVar70) * sVar70 | (ushort)(sVar56 >= sVar70) * sVar56;
                    auVar80 = *(undefined1 (*) [16])((long)*local_198 + lVar34);
                    lVar34 = lVar34 + 0x10;
                  }
                  for (iVar32 = 0; iVar32 != 8; iVar32 = iVar32 + 1) {
                    uVar15 = uVar27;
                    if (s2_beg == 0) {
                      uVar15 = ptr_00[uVar26 + 1] - open;
                    }
                    uVar24 = (ulong)uVar15;
                    if ((int)uVar15 < -0x7fff) {
                      uVar24 = 0xffff8000;
                    }
                    uVar52 = auVar53._0_8_;
                    auVar53._8_8_ = auVar53._8_8_ << 0x10 | uVar52 >> 0x30;
                    auVar53._0_8_ = uVar52 << 0x10 | uVar24 & 0xffff;
                    uVar24 = 0;
                    palVar18 = ptr_01;
                    while (uVar19 != uVar24) {
                      sVar56 = (short)(*palVar18)[0];
                      sVar60 = *(short *)((long)*palVar18 + 2);
                      sVar62 = *(short *)((long)*palVar18 + 4);
                      sVar64 = *(short *)((long)*palVar18 + 6);
                      sVar66 = (short)(*palVar18)[1];
                      sVar68 = *(short *)((long)*palVar18 + 10);
                      sVar70 = *(short *)((long)*palVar18 + 0xc);
                      sVar51 = *(short *)((long)*palVar18 + 0xe);
                      sVar55 = auVar53._0_2_;
                      uVar35 = (ushort)(sVar56 < sVar55) * sVar55 |
                               (ushort)(sVar56 >= sVar55) * sVar56;
                      sVar55 = auVar53._2_2_;
                      uVar44 = (ushort)(sVar60 < sVar55) * sVar55 |
                               (ushort)(sVar60 >= sVar55) * sVar60;
                      sVar55 = auVar53._4_2_;
                      uVar45 = (ushort)(sVar62 < sVar55) * sVar55 |
                               (ushort)(sVar62 >= sVar55) * sVar62;
                      sVar55 = auVar53._6_2_;
                      uVar46 = (ushort)(sVar64 < sVar55) * sVar55 |
                               (ushort)(sVar64 >= sVar55) * sVar64;
                      sVar55 = auVar53._8_2_;
                      uVar47 = (ushort)(sVar66 < sVar55) * sVar55 |
                               (ushort)(sVar66 >= sVar55) * sVar66;
                      sVar55 = auVar53._10_2_;
                      uVar48 = (ushort)(sVar68 < sVar55) * sVar55 |
                               (ushort)(sVar68 >= sVar55) * sVar68;
                      sVar55 = auVar53._12_2_;
                      uVar49 = (ushort)(sVar70 < sVar55) * sVar55 |
                               (ushort)(sVar70 >= sVar55) * sVar70;
                      sVar55 = auVar53._14_2_;
                      uVar50 = (ushort)(sVar51 < sVar55) * sVar55 |
                               (ushort)(sVar51 >= sVar55) * sVar51;
                      *(ushort *)*palVar18 = uVar35;
                      *(ushort *)((long)*palVar18 + 2) = uVar44;
                      *(ushort *)((long)*palVar18 + 4) = uVar45;
                      *(ushort *)((long)*palVar18 + 6) = uVar46;
                      *(ushort *)(*palVar18 + 1) = uVar47;
                      *(ushort *)((long)*palVar18 + 10) = uVar48;
                      *(ushort *)((long)*palVar18 + 0xc) = uVar49;
                      *(ushort *)((long)*palVar18 + 0xe) = uVar50;
                      uVar71 = ((short)uVar35 < (short)uVar71) * uVar35 |
                               ((short)uVar35 >= (short)uVar71) * uVar71;
                      uVar72 = ((short)uVar44 < (short)uVar72) * uVar44 |
                               ((short)uVar44 >= (short)uVar72) * uVar72;
                      uVar73 = ((short)uVar45 < (short)uVar73) * uVar45 |
                               ((short)uVar45 >= (short)uVar73) * uVar73;
                      uVar74 = ((short)uVar46 < (short)uVar74) * uVar46 |
                               ((short)uVar46 >= (short)uVar74) * uVar74;
                      uVar75 = ((short)uVar47 < (short)uVar75) * uVar47 |
                               ((short)uVar47 >= (short)uVar75) * uVar75;
                      uVar76 = ((short)uVar48 < (short)uVar76) * uVar48 |
                               ((short)uVar48 >= (short)uVar76) * uVar76;
                      uVar77 = ((short)uVar49 < (short)uVar77) * uVar49 |
                               ((short)uVar49 >= (short)uVar77) * uVar77;
                      uVar78 = ((short)uVar50 < (short)uVar78) * uVar50 |
                               ((short)uVar50 >= (short)uVar78) * uVar78;
                      sVar55 = auVar40._0_2_;
                      sVar56 = auVar40._2_2_;
                      sVar60 = auVar40._4_2_;
                      sVar62 = auVar40._6_2_;
                      sVar64 = auVar40._8_2_;
                      sVar66 = auVar40._10_2_;
                      sVar68 = auVar40._12_2_;
                      sVar70 = auVar40._14_2_;
                      vH_00[0] = uVar24 & 0xffffffff;
                      vH_00[1] = uVar19;
                      arr_store_si128(((ppVar17->field_4).rowcols)->score_row,vH_00,t,s2Len,
                                      (int32_t)uVar29,in_stack_fffffffffffffe58);
                      auVar40._2_2_ =
                           (sVar56 < (short)uVar44) * uVar44 |
                           (ushort)(sVar56 >= (short)uVar44) * sVar56;
                      auVar40._0_2_ =
                           (sVar55 < (short)uVar35) * uVar35 |
                           (ushort)(sVar55 >= (short)uVar35) * sVar55;
                      auVar40._4_2_ =
                           (sVar60 < (short)uVar45) * uVar45 |
                           (ushort)(sVar60 >= (short)uVar45) * sVar60;
                      auVar40._6_2_ =
                           (sVar62 < (short)uVar46) * uVar46 |
                           (ushort)(sVar62 >= (short)uVar46) * sVar62;
                      auVar40._8_2_ =
                           (sVar64 < (short)uVar47) * uVar47 |
                           (ushort)(sVar64 >= (short)uVar47) * sVar64;
                      auVar40._10_2_ =
                           (sVar66 < (short)uVar48) * uVar48 |
                           (ushort)(sVar66 >= (short)uVar48) * sVar66;
                      auVar40._12_2_ =
                           (sVar68 < (short)uVar49) * uVar49 |
                           (ushort)(sVar68 >= (short)uVar49) * sVar68;
                      auVar40._14_2_ =
                           (sVar70 < (short)uVar50) * uVar50 |
                           (ushort)(sVar70 >= (short)uVar50) * sVar70;
                      auVar7._2_2_ = uVar44;
                      auVar7._0_2_ = uVar35;
                      auVar7._4_2_ = uVar45;
                      auVar7._6_2_ = uVar46;
                      auVar7._8_2_ = uVar47;
                      auVar7._10_2_ = uVar48;
                      auVar7._12_2_ = uVar49;
                      auVar7._14_2_ = uVar50;
                      auVar12._4_4_ = uVar36;
                      auVar12._0_4_ = uVar36;
                      auVar12._8_4_ = uVar36;
                      auVar12._12_4_ = uVar36;
                      auVar80 = psubsw(auVar7,auVar12);
                      auVar10._4_4_ = uVar37;
                      auVar10._0_4_ = uVar37;
                      auVar10._8_4_ = uVar37;
                      auVar10._12_4_ = uVar37;
                      auVar53 = psubsw(auVar53,auVar10);
                      auVar42._0_2_ = -(ushort)(auVar80._0_2_ < auVar53._0_2_);
                      auVar42._2_2_ = -(ushort)(auVar80._2_2_ < auVar53._2_2_);
                      auVar42._4_2_ = -(ushort)(auVar80._4_2_ < auVar53._4_2_);
                      auVar42._6_2_ = -(ushort)(auVar80._6_2_ < auVar53._6_2_);
                      auVar42._8_2_ = -(ushort)(auVar80._8_2_ < auVar53._8_2_);
                      auVar42._10_2_ = -(ushort)(auVar80._10_2_ < auVar53._10_2_);
                      auVar42._12_2_ = -(ushort)(auVar80._12_2_ < auVar53._12_2_);
                      auVar42._14_2_ = -(ushort)(auVar80._14_2_ < auVar53._14_2_);
                      uVar24 = uVar24 + 1;
                      palVar18 = palVar18 + 1;
                      if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar42 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar42 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar42 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar42 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar42 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar42 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar42 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar42 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar42 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar42 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42._14_2_ >> 7 & 1) == 0) && (auVar42._14_2_ & 0x8000) == 0)
                      goto LAB_0066ae4e;
                    }
                  }
LAB_0066ae4e:
                  palVar18 = ptr_01 + uVar38;
                  sVar55 = (short)(*palVar18)[0];
                  sVar56 = *(short *)((long)*palVar18 + 2);
                  sVar60 = *(short *)((long)*palVar18 + 4);
                  sVar62 = *(short *)((long)*palVar18 + 6);
                  sVar64 = (short)(*palVar18)[1];
                  sVar66 = *(short *)((long)*palVar18 + 10);
                  sVar68 = *(short *)((long)*palVar18 + 0xc);
                  sVar70 = *(short *)((long)*palVar18 + 0xe);
                  local_68 = auVar41._0_2_;
                  sStack_66 = auVar41._2_2_;
                  sStack_64 = auVar41._4_2_;
                  sStack_62 = auVar41._6_2_;
                  sStack_60 = auVar41._8_2_;
                  sStack_5e = auVar41._10_2_;
                  sStack_5c = auVar41._12_2_;
                  sStack_5a = auVar41._14_2_;
                  auVar54._0_2_ = -(ushort)(local_68 < sVar55);
                  auVar54._2_2_ = -(ushort)(sStack_66 < sVar56);
                  auVar54._4_2_ = -(ushort)(sStack_64 < sVar60);
                  auVar54._6_2_ = -(ushort)(sStack_62 < sVar62);
                  auVar54._8_2_ = -(ushort)(sStack_60 < sVar64);
                  auVar54._10_2_ = -(ushort)(sStack_5e < sVar66);
                  auVar54._12_2_ = -(ushort)(sStack_5c < sVar68);
                  auVar54._14_2_ = -(ushort)(sStack_5a < sVar70);
                  auVar8._2_2_ = -(ushort)(sStack_e6 == 6);
                  auVar8._0_2_ = -(ushort)(local_e8 == 7);
                  auVar8._4_2_ = -(ushort)(local_e8 == 5);
                  auVar8._6_2_ = -(ushort)(sStack_e6 == 4);
                  auVar8._8_2_ = -(ushort)(local_e8 == 3);
                  auVar8._10_2_ = -(ushort)(sStack_e6 == 2);
                  auVar8._12_2_ = -(ushort)(local_e8 == 1);
                  auVar8._14_2_ = -(ushort)(sStack_e6 == 0);
                  auVar54 = auVar54 & auVar8;
                  if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar54 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar54 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar54 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar54 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar54 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar54 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar54 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar54 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar54 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar54 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar54[0xf] < '\0') {
                    iVar16 = t;
                  }
                  auVar41._0_2_ =
                       (ushort)(local_68 < sVar55) * sVar55 |
                       (ushort)(local_68 >= sVar55) * local_68;
                  auVar41._2_2_ =
                       (ushort)(sStack_66 < sVar56) * sVar56 |
                       (ushort)(sStack_66 >= sVar56) * sStack_66;
                  auVar41._4_2_ =
                       (ushort)(sStack_64 < sVar60) * sVar60 |
                       (ushort)(sStack_64 >= sVar60) * sStack_64;
                  auVar41._6_2_ =
                       (ushort)(sStack_62 < sVar62) * sVar62 |
                       (ushort)(sStack_62 >= sVar62) * sStack_62;
                  auVar41._8_2_ =
                       (ushort)(sStack_60 < sVar64) * sVar64 |
                       (ushort)(sStack_60 >= sVar64) * sStack_60;
                  auVar41._10_2_ =
                       (ushort)(sStack_5e < sVar66) * sVar66 |
                       (ushort)(sStack_5e >= sVar66) * sStack_5e;
                  auVar41._12_2_ =
                       (ushort)(sStack_5c < sVar68) * sVar68 |
                       (ushort)(sStack_5c >= sVar68) * sStack_5c;
                  auVar41._14_2_ =
                       (ushort)(sStack_5a < sVar70) * sVar70 |
                       (ushort)(sStack_5a >= sVar70) * sStack_5a;
                  uVar26 = uVar26 + 1;
                  palVar18 = local_198;
                  local_198 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse41_128_16",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}